

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void __thiscall kratos::StatementGraph::build_graph(StatementGraph *this)

{
  shared_ptr<kratos::Stmt> *stmt;
  undefined1 auVar1 [8];
  undefined1 local_38 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         local_38,&this->root_->stmts_);
  for (auVar1 = local_38;
      auVar1 != (undefined1  [8])
                stmts.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = (undefined1  [8])((long)auVar1 + 0x10)) {
    add_stmt_child(this,(((pointer)auVar1)->
                        super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_38);
  return;
}

Assistant:

void StatementGraph::build_graph() {
    auto stmts = root_->get_all_stmts();
    for (auto const &stmt : stmts) add_stmt_child(stmt.get());
}